

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

int Gia_ManLevelRNum(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  Gia_Obj_t *pGVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int Fill;
  int Fill_00;
  undefined8 extraout_RDX;
  undefined7 uVar11;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar10;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  
  Gia_ManCleanLevels(p,p->nObjs);
  p->nLevels = 0;
  lVar16 = (long)p->nObjs;
  if (0 < lVar16) {
    uVar10 = extraout_RDX;
    lVar17 = lVar16 + 1;
    lVar16 = lVar16 * 0xc;
    do {
      lVar18 = lVar17 + -1;
      lVar8 = (long)p->nObjs;
      if (lVar8 < lVar18) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar1 = (Gia_Obj_t *)(&pGVar3[-1].field_0x0 + lVar16);
      iVar7 = (int)lVar17;
      if (p->fGiaSimple == 0) {
        uVar14 = (uint)*(ulong *)pGVar1;
        if ((int)uVar14 < 0) goto LAB_002404a5;
        uVar10 = 0x1fffffff;
        uVar14 = uVar14 & 0x1fffffff;
        if ((uVar14 == 0x1fffffff) || (uVar14 != ((uint)(*(ulong *)pGVar1 >> 0x20) & 0x1fffffff)))
        goto LAB_002404a5;
        pVVar4 = p->vLevels;
        Vec_IntFillExtra(pVVar4,(int)lVar18,0x1fffffff);
        if (pVVar4->nSize < lVar18) goto LAB_0024083b;
        uVar9 = (lVar17 + (ulong)-uVar14) - 2;
        iVar12 = (int)uVar9;
        if ((iVar12 < 0) || (pVVar5 = p->vLevels, pVVar5->nSize <= iVar12)) goto LAB_0024083b;
        iVar15 = pVVar4->pArray[lVar17 + -2];
        uVar9 = uVar9 & 0xffffffff;
        iVar2 = pVVar5->pArray[uVar9];
        Vec_IntFillExtra(pVVar5,~uVar14 + iVar7,Fill_00);
        if (pVVar5->nSize <= iVar12) goto LAB_00240879;
        if (iVar15 < iVar2) {
          iVar15 = iVar2;
        }
        pVVar5->pArray[uVar9] = iVar15;
        uVar10 = extraout_RDX_02;
      }
      else {
LAB_002404a5:
        uVar14 = (uint)*(ulong *)pGVar1;
        uVar11 = (undefined7)((ulong)uVar10 >> 8);
        uVar9 = *(ulong *)pGVar1 & 0x1fffffff;
        if (uVar9 == 0x1fffffff || (int)uVar14 < 0) {
          bVar19 = (int)uVar9 == 0x1fffffff;
          iVar12 = (int)CONCAT71(uVar11,-1 < (int)uVar14 || bVar19);
          if (-1 < (int)uVar14 || bVar19) {
            if (lVar8 < lVar18) goto LAB_0024085a;
            iVar15 = p->nLevels;
            pVVar4 = p->vLevels;
            Vec_IntFillExtra(pVVar4,iVar7 + -1,iVar12);
            if (pVVar4->nSize < lVar18) goto LAB_0024083b;
            iVar7 = pVVar4->pArray[lVar17 + -2];
            if (pVVar4->pArray[lVar17 + -2] < iVar15) {
              iVar7 = iVar15;
            }
            p->nLevels = iVar7;
            uVar10 = extraout_RDX_03;
          }
          else {
            uVar9 = (lVar17 + (ulong)-(uVar14 & 0x1fffffff)) - 2;
            iVar15 = (int)uVar9;
            if ((iVar15 < 0) || (pVVar4 = p->vLevels, pVVar4->nSize <= iVar15)) goto LAB_0024083b;
            uVar9 = uVar9 & 0xffffffff;
            iVar2 = pVVar4->pArray[uVar9];
            Vec_IntFillExtra(pVVar4,~(uVar14 & 0x1fffffff) + iVar7,iVar12);
            if (pVVar4->nSize <= iVar15) goto LAB_00240879;
            if (iVar2 < 2) {
              iVar2 = 1;
            }
            pVVar4->pArray[uVar9] = iVar2;
            uVar10 = extraout_RDX_01;
          }
        }
        else {
          if (lVar8 < lVar18) {
LAB_0024085a:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          pVVar4 = p->vLevels;
          Vec_IntFillExtra(pVVar4,iVar7 + -1,(int)CONCAT71(uVar11,(int)uVar14 < 0));
          if (pVVar4->nSize < lVar18) {
LAB_0024083b:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar9 = (lVar17 + (ulong)-(uVar14 & 0x1fffffff)) - 2;
          iVar12 = (int)uVar9;
          if ((iVar12 < 0) || (pVVar5 = p->vLevels, pVVar5->nSize <= iVar12)) goto LAB_0024083b;
          iVar15 = pVVar4->pArray[lVar17 + -2];
          uVar9 = uVar9 & 0xffffffff;
          iVar2 = pVVar5->pArray[uVar9];
          Vec_IntFillExtra(pVVar5,~(uVar14 & 0x1fffffff) + iVar7,iVar12);
          if (pVVar5->nSize <= iVar12) {
LAB_00240879:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          iVar15 = iVar15 + 1;
          if (iVar15 < iVar2) {
            iVar15 = iVar2;
          }
          pVVar5->pArray[uVar9] = iVar15;
          pGVar6 = p->pObjs;
          if ((pGVar1 < pGVar6) || (pGVar6 + p->nObjs <= pGVar1)) goto LAB_0024085a;
          uVar13 = *(uint *)&pGVar1->field_0x4 & 0x1fffffff;
          uVar14 = (int)((long)pGVar3 + ((lVar16 + -0xc) - (long)pGVar6) >> 2) * -0x55555555;
          pVVar4 = p->vLevels;
          Vec_IntFillExtra(pVVar4,uVar14 + 1,(int)pGVar1);
          if (((int)uVar14 < 0) || (pVVar4->nSize <= (int)uVar14)) goto LAB_0024083b;
          uVar9 = (lVar17 + (ulong)-uVar13) - 2;
          iVar12 = (int)uVar9;
          if ((iVar12 < 0) || (pVVar5 = p->vLevels, pVVar5->nSize <= iVar12)) goto LAB_0024083b;
          iVar15 = pVVar4->pArray[uVar14 & 0x7fffffff];
          uVar9 = uVar9 & 0xffffffff;
          iVar2 = pVVar5->pArray[uVar9];
          Vec_IntFillExtra(pVVar5,~uVar13 + iVar7,Fill);
          if (pVVar5->nSize <= iVar12) goto LAB_00240879;
          iVar15 = iVar15 + 1;
          if (iVar15 < iVar2) {
            iVar15 = iVar2;
          }
          pVVar5->pArray[uVar9] = iVar15;
          uVar10 = extraout_RDX_00;
        }
      }
      lVar17 = lVar18;
      lVar16 = lVar16 + -0xc;
    } while (1 < lVar18);
  }
  return p->nLevels;
}

Assistant:

int Gia_ManLevelRNum( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManCleanLevels( p, Gia_ManObjNum(p) );
    p->nLevels = 0;
    Gia_ManForEachObjReverse( p, pObj, i )
    {
        if ( !p->fGiaSimple && Gia_ObjIsBuf(pObj) )
            Gia_ObjUpdateLevelId( p, Gia_ObjFaninId0(pObj, i), Gia_ObjLevel(p, pObj) );
        else if ( Gia_ObjIsAnd(pObj) )
        {
            Gia_ObjUpdateLevelId( p, Gia_ObjFaninId0(pObj, i), 1+Gia_ObjLevel(p, pObj) );
            Gia_ObjUpdateLevelId( p, Gia_ObjFaninId1(pObj, i), 1+Gia_ObjLevel(p, pObj) );
        }
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjUpdateLevelId( p, Gia_ObjFaninId0(pObj, i), 1 );
        else
            p->nLevels = Abc_MaxInt( p->nLevels, Gia_ObjLevel(p, pObj) );
    }
    return p->nLevels;
}